

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O0

void __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::cancel
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this)

{
  service_type *psVar1;
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
  *in_RDI;
  error_code ec;
  error_code *in_stack_ffffffffffffffd0;
  error_code *err;
  error_code *in_stack_ffffffffffffffe0;
  base_implementation_type *in_stack_ffffffffffffffe8;
  reactive_socket_service_base *in_stack_fffffffffffffff0;
  
  CLI::std::error_code::error_code(in_stack_ffffffffffffffd0);
  psVar1 = asio::detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
           ::get_service(in_RDI);
  err = (error_code *)&psVar1->super_reactive_socket_service_base;
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  get_implementation(in_RDI);
  asio::detail::reactive_socket_service_base::cancel
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  asio::detail::throw_error(err,(char *)in_RDI);
  return;
}

Assistant:

void cancel()
  {
    asio::error_code ec;
    impl_.get_service().cancel(impl_.get_implementation(), ec);
    asio::detail::throw_error(ec, "cancel");
  }